

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O2

void __thiscall
tchecker::details::
statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>::visit
          (statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
           *this,typed_local_var_statement_t *stmt)

{
  typed_var_expression_t *ptVar1;
  typed_expression_t *ptVar2;
  rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  rvalue_compiler;
  lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  lvalue_compiler;
  value_type_conflict2 local_48;
  undefined **local_40;
  vector<long,_std::allocator<long>_> *local_38;
  undefined **local_30;
  vector<long,_std::allocator<long>_> *local_28;
  
  local_28 = (this->_bytecode_back_inserter).container;
  local_30 = &PTR__typed_expression_visitor_t_00226760;
  ptVar1 = typed_local_var_statement_t::variable(stmt);
  (**(code **)(*(long *)&(ptVar1->super_typed_lvalue_expression_t).super_typed_expression_t + 0x30))
            (ptVar1,&local_30);
  local_38 = (this->_bytecode_back_inserter).container;
  local_40 = &PTR__typed_expression_visitor_t_002266c8;
  ptVar2 = typed_local_var_statement_t::initial_value(stmt);
  (**(code **)(*(long *)ptVar2 + 0x30))(ptVar2,&local_40);
  local_48 = 0x1c;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,&local_48);
  return;
}

Assistant:

virtual void visit(tchecker::typed_local_var_statement_t const & stmt)
  {
    tchecker::details::lvalue_expression_compiler_t<BYTECODE_BACK_INSERTER> lvalue_compiler(_bytecode_back_inserter);
    stmt.variable().visit(lvalue_compiler);
    tchecker::details::rvalue_expression_compiler_t<BYTECODE_BACK_INSERTER> rvalue_compiler(_bytecode_back_inserter);
    stmt.initial_value().visit(rvalue_compiler);
    _bytecode_back_inserter = VM_INIT_FRAME;
  }